

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O3

uint8_vec * __thiscall crnlib::ktx_texture::find_key(ktx_texture *this,char *pKey)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  uint8_vec *v;
  uint8_vec *puVar4;
  
  sVar2 = strlen(pKey);
  uVar3 = (ulong)(this->m_key_values).m_size;
  if (uVar3 != 0) {
    puVar4 = (this->m_key_values).m_p;
    do {
      if ((sVar2 + 1 <= (ulong)puVar4->m_size) &&
         (iVar1 = bcmp(puVar4->m_p,pKey,sVar2 + 1), iVar1 == 0)) {
        return puVar4;
      }
      puVar4 = puVar4 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return (uint8_vec *)0x0;
}

Assistant:

const uint8_vec* ktx_texture::find_key(const char* pKey) const
    {
        const size_t n = strlen(pKey) + 1;
        for (uint i = 0; i < m_key_values.size(); i++)
        {
            const uint8_vec& v = m_key_values[i];
            if ((v.size() >= n) && (!memcmp(&v[0], pKey, n)))
            {
                return &v;
            }
        }

        return nullptr;
    }